

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O1

TestCase *
vkt::pipeline::anon_unknown_0::newTestCase<vkt::pipeline::(anonymous_namespace)::BasicGraphicsTest>
          (TestContext *testContext,TimestampTestParam *testParam)

{
  TimestampTest *this;
  allocator<char> local_9a;
  allocator<char> local_99;
  long *local_98 [2];
  long local_88 [2];
  string local_78;
  long *local_58 [2];
  long local_48 [2];
  string local_38;
  
  this = (TimestampTest *)operator_new(0x90);
  (**testParam->_vptr_TimestampTestParam)(local_58,testParam);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,(char *)local_58[0],&local_99);
  (*testParam->_vptr_TimestampTestParam[1])(local_98,testParam);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,(char *)local_98[0],&local_9a);
  TimestampTest::TimestampTest(this,testContext,&local_38,&local_78,testParam);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TimestampTest_00d20200;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return &this->super_TestCase;
}

Assistant:

vkt::TestCase* newTestCase(tcu::TestContext&     testContext,
						   TimestampTestParam*   testParam)
{
	return new Test(testContext,
					testParam->generateTestName().c_str(),
					testParam->generateTestDescription().c_str(),
					testParam);
}